

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O1

void __thiscall Samba::writeBinary(Samba *this,uint8_t *buffer,int size)

{
  SerialPort *pSVar1;
  uint uVar2;
  undefined8 *puVar3;
  
  if (size != 0) {
    do {
      pSVar1 = (this->_port)._M_t.
               super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
               super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
               super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
      uVar2 = (*pSVar1->_vptr_SerialPort[6])(pSVar1,buffer,(ulong)(uint)size);
      if ((int)uVar2 < 1) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar3 = &PTR__exception_001195a0;
        __cxa_throw(puVar3,&SambaError::typeinfo,std::exception::~exception);
      }
      buffer = buffer + uVar2;
      size = size - uVar2;
    } while (size != 0);
  }
  return;
}

Assistant:

void
Samba::writeBinary(const uint8_t* buffer, int size)
{
    while (size)
    {
        int written = _port->write(buffer, size);
        if (written <= 0)
            throw SambaError();
        buffer += written;
        size -= written;
    }
}